

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar51;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  undefined1 local_1660 [16];
  ulong local_1650;
  ulong local_1648;
  ulong local_1640;
  Scene *local_1638;
  ulong *local_1630;
  long local_1628;
  ulong local_1620;
  ulong local_1618;
  RTCFilterFunctionNArguments local_1610;
  undefined1 local_15e0 [16];
  RTCHitN local_15d0 [16];
  undefined1 local_15c0 [16];
  undefined1 local_15b0 [16];
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  uint local_1560;
  uint uStack_155c;
  uint uStack_1558;
  uint uStack_1554;
  uint uStack_1550;
  uint uStack_154c;
  uint uStack_1548;
  uint uStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1630 = local_11f8;
  local_1200 = root.ptr;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar67 = ZEXT3264(auVar37);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar68 = ZEXT3264(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar69 = ZEXT3264(auVar39);
  auVar34 = vmulss_avx512f(auVar37._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar48._0_4_ = auVar34._0_4_;
  auVar48._4_4_ = auVar48._0_4_;
  auVar48._8_4_ = auVar48._0_4_;
  auVar48._12_4_ = auVar48._0_4_;
  auVar48._16_4_ = auVar48._0_4_;
  auVar48._20_4_ = auVar48._0_4_;
  auVar48._24_4_ = auVar48._0_4_;
  auVar48._28_4_ = auVar48._0_4_;
  auVar34 = vmulss_avx512f(auVar38._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar49._0_4_ = auVar34._0_4_;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar49._16_4_ = auVar49._0_4_;
  auVar49._20_4_ = auVar49._0_4_;
  auVar49._24_4_ = auVar49._0_4_;
  auVar49._28_4_ = auVar49._0_4_;
  auVar34 = vmulss_avx512f(auVar39._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar39._0_4_ = auVar34._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar39._16_4_ = auVar39._0_4_;
  auVar39._20_4_ = auVar39._0_4_;
  auVar39._24_4_ = auVar39._0_4_;
  auVar39._28_4_ = auVar39._0_4_;
  local_1640 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1620 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1618 = local_1640 ^ 0x20;
  uVar28 = local_1620 ^ 0x20;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar70 = ZEXT3264(auVar37);
  auVar38 = vxorps_avx512vl(auVar48,auVar37);
  auVar71 = ZEXT3264(auVar38);
  auVar38 = vxorps_avx512vl(auVar49,auVar37);
  auVar72 = ZEXT3264(auVar38);
  auVar38 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar73 = ZEXT3264(auVar38);
  auVar38 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar74 = ZEXT3264(auVar38);
  auVar37 = vxorps_avx512vl(auVar39,auVar37);
  auVar75 = ZEXT3264(auVar37);
  auVar34 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar76 = ZEXT1664(auVar34);
  bVar32 = true;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar77 = ZEXT3264(auVar37);
  auVar34 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar78 = ZEXT1664(auVar34);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar79 = ZEXT3264(auVar37);
  do {
    uVar26 = local_1630[-1];
    local_1630 = local_1630 + -1;
    while ((uVar26 & 8) == 0) {
      auVar37 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar26 + 0x40 + local_1640),auVar71._0_32_,
                           auVar67._0_32_);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar26 + 0x40 + local_1620),auVar72._0_32_,
                           auVar68._0_32_);
      auVar37 = vpmaxsd_avx2(auVar37,auVar38);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar29),auVar75._0_32_,
                           auVar69._0_32_);
      auVar38 = vpmaxsd_avx512vl(auVar38,auVar73._0_32_);
      auVar37 = vpmaxsd_avx2(auVar37,auVar38);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar26 + 0x40 + local_1618),auVar71._0_32_,
                           auVar67._0_32_);
      auVar39 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar28),auVar72._0_32_,
                           auVar68._0_32_);
      auVar38 = vpminsd_avx2(auVar38,auVar39);
      auVar39 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar29 ^ 0x20)),auVar75._0_32_,
                           auVar69._0_32_);
      auVar39 = vpminsd_avx512vl(auVar39,auVar74._0_32_);
      auVar38 = vpminsd_avx2(auVar38,auVar39);
      uVar33 = vpcmpd_avx512vl(auVar37,auVar38,2);
      if ((char)uVar33 == '\0') goto LAB_0079e1fb;
      uVar30 = uVar26 & 0xfffffffffffffff0;
      lVar25 = 0;
      for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar26 = *(ulong *)(uVar30 + lVar25 * 8);
      uVar27 = (uint)uVar33 - 1 & (uint)uVar33;
      uVar33 = (ulong)uVar27;
      if (uVar27 != 0) {
        *local_1630 = uVar26;
        lVar25 = 0;
        for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar27 = uVar27 - 1 & uVar27;
        uVar33 = (ulong)uVar27;
        bVar31 = uVar27 == 0;
        while( true ) {
          local_1630 = local_1630 + 1;
          uVar26 = *(ulong *)(uVar30 + lVar25 * 8);
          if (bVar31) break;
          *local_1630 = uVar26;
          lVar25 = 0;
          for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          bVar31 = uVar33 == 0;
        }
      }
    }
    local_1628 = (ulong)((uint)uVar26 & 0xf) - 8;
    if (local_1628 != 0) {
      uVar26 = uVar26 & 0xfffffffffffffff0;
      lVar25 = 0;
      do {
        lVar24 = lVar25 * 0x60;
        local_1638 = context->scene;
        ppfVar4 = (local_1638->vertices).items;
        pfVar5 = ppfVar4[*(uint *)(uVar26 + 0x48 + lVar24)];
        auVar45._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar26 + 0x28 + lVar24));
        auVar45._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar26 + 8 + lVar24));
        pfVar6 = ppfVar4[*(uint *)(uVar26 + 0x40 + lVar24)];
        auVar52._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x20 + lVar24));
        auVar52._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + lVar24));
        pfVar7 = ppfVar4[*(uint *)(uVar26 + 0x4c + lVar24)];
        auVar58._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x2c + lVar24));
        auVar58._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0xc + lVar24));
        pfVar8 = ppfVar4[*(uint *)(uVar26 + 0x44 + lVar24)];
        auVar61._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x24 + lVar24));
        auVar61._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 4 + lVar24));
        lVar1 = uVar26 + 0x40 + lVar24;
        local_1400 = *(undefined8 *)(lVar1 + 0x10);
        uStack_13f8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_13f0 = local_1400;
        uStack_13e8 = uStack_13f8;
        lVar1 = uVar26 + 0x50 + lVar24;
        local_1420 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1418 = *(undefined8 *)(lVar1 + 0x18);
        auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x10 + lVar24)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar26 + 0x18 + lVar24)));
        auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x10 + lVar24)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar26 + 0x18 + lVar24)));
        auVar11 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x14 + lVar24)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x1c + lVar24)));
        auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x14 + lVar24)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x1c + lVar24)));
        auVar12 = vunpcklps_avx(auVar34,auVar35);
        auVar13 = vunpcklps_avx(auVar36,auVar11);
        auVar34 = vunpckhps_avx(auVar36,auVar11);
        auVar11 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x30 + lVar24)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar26 + 0x38 + lVar24)));
        auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + 0x30 + lVar24)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar26 + 0x38 + lVar24)));
        auVar14 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x34 + lVar24)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x3c + lVar24)));
        auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x34 + lVar24)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x3c + lVar24)));
        auVar36 = vunpcklps_avx(auVar35,auVar36);
        auVar15 = vunpcklps_avx(auVar11,auVar14);
        auVar35 = vunpckhps_avx(auVar11,auVar14);
        uStack_1410 = local_1420;
        uStack_1408 = uStack_1418;
        auVar37 = vunpcklps_avx(auVar61,auVar58);
        auVar38 = vunpcklps_avx(auVar52,auVar45);
        auVar43 = vunpcklps_avx(auVar38,auVar37);
        auVar44 = vunpckhps_avx(auVar38,auVar37);
        auVar37 = vunpckhps_avx(auVar61,auVar58);
        auVar38 = vunpckhps_avx(auVar52,auVar45);
        auVar45 = vunpcklps_avx(auVar38,auVar37);
        auVar37._16_16_ = auVar13;
        auVar37._0_16_ = auVar13;
        auVar38._16_16_ = auVar34;
        auVar38._0_16_ = auVar34;
        auVar50._16_16_ = auVar12;
        auVar50._0_16_ = auVar12;
        auVar59._16_16_ = auVar15;
        auVar59._0_16_ = auVar15;
        auVar57._16_16_ = auVar35;
        auVar57._0_16_ = auVar35;
        auVar47._16_16_ = auVar36;
        auVar47._0_16_ = auVar36;
        auVar37 = vsubps_avx(auVar43,auVar37);
        auVar38 = vsubps_avx(auVar44,auVar38);
        auVar39 = vsubps_avx(auVar45,auVar50);
        auVar48 = vsubps_avx(auVar59,auVar43);
        auVar49 = vsubps_avx(auVar57,auVar44);
        auVar47 = vsubps_avx(auVar47,auVar45);
        auVar40._4_4_ = auVar38._4_4_ * auVar47._4_4_;
        auVar40._0_4_ = auVar38._0_4_ * auVar47._0_4_;
        auVar40._8_4_ = auVar38._8_4_ * auVar47._8_4_;
        auVar40._12_4_ = auVar38._12_4_ * auVar47._12_4_;
        auVar40._16_4_ = auVar38._16_4_ * auVar47._16_4_;
        auVar40._20_4_ = auVar38._20_4_ * auVar47._20_4_;
        auVar40._24_4_ = auVar38._24_4_ * auVar47._24_4_;
        auVar40._28_4_ = auVar36._12_4_;
        auVar35 = vfmsub231ps_fma(auVar40,auVar49,auVar39);
        auVar41._4_4_ = auVar39._4_4_ * auVar48._4_4_;
        auVar41._0_4_ = auVar39._0_4_ * auVar48._0_4_;
        auVar41._8_4_ = auVar39._8_4_ * auVar48._8_4_;
        auVar41._12_4_ = auVar39._12_4_ * auVar48._12_4_;
        auVar41._16_4_ = auVar39._16_4_ * auVar48._16_4_;
        auVar41._20_4_ = auVar39._20_4_ * auVar48._20_4_;
        auVar41._24_4_ = auVar39._24_4_ * auVar48._24_4_;
        auVar41._28_4_ = auVar12._12_4_;
        auVar36 = vfmsub231ps_fma(auVar41,auVar47,auVar37);
        auVar46._4_4_ = auVar37._4_4_ * auVar49._4_4_;
        auVar46._0_4_ = auVar37._0_4_ * auVar49._0_4_;
        auVar46._8_4_ = auVar37._8_4_ * auVar49._8_4_;
        auVar46._12_4_ = auVar37._12_4_ * auVar49._12_4_;
        auVar46._16_4_ = auVar37._16_4_ * auVar49._16_4_;
        auVar46._20_4_ = auVar37._20_4_ * auVar49._20_4_;
        auVar46._24_4_ = auVar37._24_4_ * auVar49._24_4_;
        auVar46._28_4_ = auVar13._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar62._4_4_ = uVar2;
        auVar62._0_4_ = uVar2;
        auVar62._8_4_ = uVar2;
        auVar62._12_4_ = uVar2;
        auVar62._16_4_ = uVar2;
        auVar62._20_4_ = uVar2;
        auVar62._24_4_ = uVar2;
        auVar62._28_4_ = uVar2;
        auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar42._4_4_ = uVar2;
        auVar42._0_4_ = uVar2;
        auVar42._8_4_ = uVar2;
        auVar42._12_4_ = uVar2;
        auVar42._16_4_ = uVar2;
        auVar42._20_4_ = uVar2;
        auVar42._24_4_ = uVar2;
        auVar42._28_4_ = uVar2;
        auVar42 = vsubps_avx512vl(auVar43,auVar42);
        auVar11 = vfmsub231ps_fma(auVar46,auVar48,auVar38);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar43._4_4_ = uVar2;
        auVar43._0_4_ = uVar2;
        auVar43._8_4_ = uVar2;
        auVar43._12_4_ = uVar2;
        auVar43._16_4_ = uVar2;
        auVar43._20_4_ = uVar2;
        auVar43._24_4_ = uVar2;
        auVar43._28_4_ = uVar2;
        auVar43 = vsubps_avx512vl(auVar44,auVar43);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar44._4_4_ = uVar2;
        auVar44._0_4_ = uVar2;
        auVar44._8_4_ = uVar2;
        auVar44._12_4_ = uVar2;
        auVar44._16_4_ = uVar2;
        auVar44._20_4_ = uVar2;
        auVar44._24_4_ = uVar2;
        auVar44._28_4_ = uVar2;
        auVar44 = vsubps_avx512vl(auVar45,auVar44);
        auVar45 = vmulps_avx512vl(auVar40,auVar44);
        auVar45 = vfmsub231ps_avx512vl(auVar45,auVar43,auVar41);
        auVar46 = vmulps_avx512vl(auVar41,auVar42);
        auVar12 = vfmsub231ps_fma(auVar46,auVar44,auVar62);
        auVar46 = vmulps_avx512vl(auVar62,auVar43);
        auVar46 = vfmsub231ps_avx512vl(auVar46,auVar42,auVar40);
        auVar41 = vmulps_avx512vl(ZEXT1632(auVar11),auVar41);
        auVar40 = vfmadd231ps_avx512vl(auVar41,ZEXT1632(auVar36),auVar40);
        local_1380 = vfmadd231ps_avx512vl(auVar40,ZEXT1632(auVar35),auVar62);
        vandps_avx512vl(local_1380,auVar77._0_32_);
        vandps_avx512vl(local_1380,auVar70._0_32_);
        auVar47 = vmulps_avx512vl(auVar47,auVar46);
        auVar34 = vfmadd231ps_fma(auVar47,ZEXT1632(auVar12),auVar49);
        auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar45,auVar48);
        fVar51 = local_1380._0_4_;
        local_13e0._0_4_ = (float)((uint)fVar51 ^ auVar34._0_4_);
        fVar54 = local_1380._4_4_;
        local_13e0._4_4_ = (float)((uint)fVar54 ^ auVar34._4_4_);
        fVar55 = local_1380._8_4_;
        local_13e0._8_4_ = (float)((uint)fVar55 ^ auVar34._8_4_);
        fVar56 = local_1380._12_4_;
        local_13e0._12_4_ = (float)((uint)fVar56 ^ auVar34._12_4_);
        fVar63 = local_1380._16_4_;
        local_13e0._16_4_ = fVar63;
        fVar64 = local_1380._20_4_;
        local_13e0._20_4_ = fVar64;
        fVar65 = local_1380._24_4_;
        local_13e0._24_4_ = fVar65;
        fStack_1284 = local_1380._28_4_;
        local_13e0._28_4_ = fStack_1284;
        auVar39 = vmulps_avx512vl(auVar39,auVar46);
        auVar34 = vfmadd231ps_fma(auVar39,auVar38,ZEXT1632(auVar12));
        auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar37,auVar45);
        local_13c0._0_4_ = (float)((uint)fVar51 ^ auVar34._0_4_);
        local_13c0._4_4_ = (float)((uint)fVar54 ^ auVar34._4_4_);
        local_13c0._8_4_ = (float)((uint)fVar55 ^ auVar34._8_4_);
        local_13c0._12_4_ = (float)((uint)fVar56 ^ auVar34._12_4_);
        local_13c0._16_4_ = fVar63;
        local_13c0._20_4_ = fVar64;
        local_13c0._24_4_ = fVar65;
        local_13c0._28_4_ = fStack_1284;
        auVar37 = auVar78._0_32_;
        uVar16 = vcmpps_avx512vl(local_13e0,auVar37,5);
        uVar17 = vcmpps_avx512vl(local_13c0,auVar37,5);
        uVar18 = vcmpps_avx512vl(local_1380,auVar37,4);
        auVar66._0_4_ = local_13e0._0_4_ + local_13c0._0_4_;
        auVar66._4_4_ = local_13e0._4_4_ + local_13c0._4_4_;
        auVar66._8_4_ = local_13e0._8_4_ + local_13c0._8_4_;
        auVar66._12_4_ = local_13e0._12_4_ + local_13c0._12_4_;
        auVar66._16_4_ = fVar63 + fVar63;
        auVar66._20_4_ = fVar64 + fVar64;
        auVar66._24_4_ = fVar65 + fVar65;
        auVar66._28_4_ = fStack_1284 + fStack_1284;
        uVar19 = vcmpps_avx512vl(auVar66,local_1380,2);
        local_1300 = (byte)uVar16 & (byte)uVar17 & (byte)uVar18 & (byte)uVar19;
        if (local_1300 != 0) {
          auVar21._4_4_ = auVar44._4_4_ * auVar11._4_4_;
          auVar21._0_4_ = auVar44._0_4_ * auVar11._0_4_;
          auVar21._8_4_ = auVar44._8_4_ * auVar11._8_4_;
          auVar21._12_4_ = auVar44._12_4_ * auVar11._12_4_;
          auVar21._16_4_ = auVar44._16_4_ * 0.0;
          auVar21._20_4_ = auVar44._20_4_ * 0.0;
          auVar21._24_4_ = auVar44._24_4_ * 0.0;
          auVar21._28_4_ = auVar44._28_4_;
          auVar34 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar36),auVar21);
          auVar34 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar35),ZEXT1632(auVar34));
          local_13a0._0_4_ = (float)((uint)fVar51 ^ auVar34._0_4_);
          local_13a0._4_4_ = (float)((uint)fVar54 ^ auVar34._4_4_);
          local_13a0._8_4_ = (float)((uint)fVar55 ^ auVar34._8_4_);
          local_13a0._12_4_ = (float)((uint)fVar56 ^ auVar34._12_4_);
          local_13a0._16_4_ = fVar63;
          local_13a0._20_4_ = fVar64;
          local_13a0._24_4_ = fVar65;
          local_13a0._28_4_ = fStack_1284;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar20._4_4_ = uVar2;
          auVar20._0_4_ = uVar2;
          auVar20._8_4_ = uVar2;
          auVar20._12_4_ = uVar2;
          auVar20._16_4_ = uVar2;
          auVar20._20_4_ = uVar2;
          auVar20._24_4_ = uVar2;
          auVar20._28_4_ = uVar2;
          auVar37 = vmulps_avx512vl(local_1380,auVar20);
          uVar16 = vcmpps_avx512vl(auVar37,local_13a0,1);
          fVar3 = *(float *)(ray + k * 4 + 0x80);
          auVar60 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,
                                                  CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,
                                                  fVar3))))))));
          auVar22._4_4_ = fVar3 * fVar54;
          auVar22._0_4_ = fVar3 * fVar51;
          auVar22._8_4_ = fVar3 * fVar55;
          auVar22._12_4_ = fVar3 * fVar56;
          auVar22._16_4_ = fVar3 * fVar63;
          auVar22._20_4_ = fVar3 * fVar64;
          auVar22._24_4_ = fVar3 * fVar65;
          auVar22._28_4_ = auVar37._28_4_;
          uVar17 = vcmpps_avx512vl(local_13a0,auVar22,2);
          local_1300 = (byte)uVar16 & (byte)uVar17 & local_1300;
          if (local_1300 != 0) {
            local_1360 = ZEXT1632(auVar35);
            local_1340 = ZEXT1632(auVar36);
            local_1320 = ZEXT1632(auVar11);
            local_1220 = 0xf0;
            auVar37 = vrcp14ps_avx512vl(local_1380);
            auVar48 = auVar79._0_32_;
            auVar38 = vfnmadd213ps_avx512vl(local_1380,auVar37,auVar48);
            auVar34 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
            fVar51 = auVar34._0_4_;
            fVar54 = auVar34._4_4_;
            fVar55 = auVar34._8_4_;
            fVar56 = auVar34._12_4_;
            local_12a0[0] = fVar51 * local_13a0._0_4_;
            local_12a0[1] = fVar54 * local_13a0._4_4_;
            local_12a0[2] = fVar55 * local_13a0._8_4_;
            local_12a0[3] = fVar56 * local_13a0._12_4_;
            fStack_1290 = fVar63 * 0.0;
            fStack_128c = fVar64 * 0.0;
            fStack_1288 = fVar65 * 0.0;
            auVar23._4_4_ = fVar54 * local_13e0._4_4_;
            auVar23._0_4_ = fVar51 * local_13e0._0_4_;
            auVar23._8_4_ = fVar55 * local_13e0._8_4_;
            auVar23._12_4_ = fVar56 * local_13e0._12_4_;
            auVar23._16_4_ = fVar63 * 0.0;
            auVar23._20_4_ = fVar64 * 0.0;
            auVar23._24_4_ = fVar65 * 0.0;
            auVar23._28_4_ = fStack_1284;
            auVar37 = vminps_avx512vl(auVar23,auVar48);
            auVar53._0_4_ = fVar51 * local_13c0._0_4_;
            auVar53._4_4_ = fVar54 * local_13c0._4_4_;
            auVar53._8_4_ = fVar55 * local_13c0._8_4_;
            auVar53._12_4_ = fVar56 * local_13c0._12_4_;
            auVar53._16_4_ = fVar63 * 0.0;
            auVar53._20_4_ = fVar64 * 0.0;
            auVar53._24_4_ = fVar65 * 0.0;
            auVar53._28_4_ = 0;
            auVar38 = vminps_avx512vl(auVar53,auVar48);
            auVar39 = vsubps_avx512vl(auVar48,auVar37);
            auVar48 = vsubps_avx512vl(auVar48,auVar38);
            local_12c0 = vblendps_avx(auVar38,auVar39,0xf0);
            local_12e0 = vblendps_avx(auVar37,auVar48,0xf0);
            fVar51 = (float)DAT_01fef940;
            local_1280._0_4_ = auVar35._0_4_ * fVar51;
            fVar54 = DAT_01fef940._4_4_;
            local_1280._4_4_ = auVar35._4_4_ * fVar54;
            fVar55 = DAT_01fef940._8_4_;
            local_1280._8_4_ = auVar35._8_4_ * fVar55;
            fVar56 = DAT_01fef940._12_4_;
            local_1280._12_4_ = auVar35._12_4_ * fVar56;
            fVar63 = DAT_01fef940._16_4_;
            local_1280._16_4_ = fVar63 * 0.0;
            fVar64 = DAT_01fef940._20_4_;
            local_1280._20_4_ = fVar64 * 0.0;
            fVar65 = DAT_01fef940._24_4_;
            local_1280._24_4_ = fVar65 * 0.0;
            local_1280._28_4_ = 0;
            local_1260._0_4_ = auVar36._0_4_ * fVar51;
            local_1260._4_4_ = auVar36._4_4_ * fVar54;
            local_1260._8_4_ = auVar36._8_4_ * fVar55;
            local_1260._12_4_ = auVar36._12_4_ * fVar56;
            local_1260._16_4_ = fVar63 * 0.0;
            local_1260._20_4_ = fVar64 * 0.0;
            local_1260._24_4_ = fVar65 * 0.0;
            local_1260._28_4_ = 0;
            local_1240._4_4_ = auVar11._4_4_ * fVar54;
            local_1240._0_4_ = auVar11._0_4_ * fVar51;
            local_1240._8_4_ = auVar11._8_4_ * fVar55;
            local_1240._12_4_ = auVar11._12_4_ * fVar56;
            local_1240._16_4_ = fVar63 * 0.0;
            local_1240._20_4_ = fVar64 * 0.0;
            local_1240._24_4_ = fVar65 * 0.0;
            local_1240._28_4_ = 0;
            local_1648 = (ulong)local_1300;
            do {
              auVar34 = auVar78._0_16_;
              local_1650 = 0;
              for (uVar33 = local_1648; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000
                  ) {
                local_1650 = local_1650 + 1;
              }
              pGVar9 = (local_1638->geometries).items[*(uint *)((long)&local_1400 + local_1650 * 4)]
                       .ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                local_1648 = local_1648 ^ 1L << (local_1650 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0079e225:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar32;
                }
                local_1540 = auVar60._0_32_;
                local_1520 = auVar75._0_32_;
                local_1500 = vmovdqa64_avx512vl(auVar74._0_32_);
                local_14e0 = vmovdqa64_avx512vl(auVar73._0_32_);
                local_14c0 = auVar72._0_32_;
                local_14a0 = auVar71._0_32_;
                local_1480 = auVar69._0_32_;
                local_1460 = auVar68._0_32_;
                local_1440 = auVar67._0_32_;
                uVar33 = (ulong)(uint)((int)local_1650 * 4);
                uVar2 = *(undefined4 *)(local_12e0 + uVar33);
                local_15a0._4_4_ = uVar2;
                local_15a0._0_4_ = uVar2;
                local_15a0._8_4_ = uVar2;
                local_15a0._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_12c0 + uVar33);
                local_1590._4_4_ = uVar2;
                local_1590._0_4_ = uVar2;
                local_1590._8_4_ = uVar2;
                local_1590._12_4_ = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12a0 + uVar33);
                local_1610.context = context->user;
                local_1570 = vpbroadcastd_avx512vl();
                uVar2 = *(undefined4 *)((long)&local_1420 + uVar33);
                local_1580._4_4_ = uVar2;
                local_1580._0_4_ = uVar2;
                local_1580._8_4_ = uVar2;
                local_1580._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1280 + uVar33);
                local_15d0._4_4_ = uVar2;
                local_15d0._0_4_ = uVar2;
                local_15d0._8_4_ = uVar2;
                local_15d0._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1260 + uVar33);
                local_15c0._4_4_ = uVar2;
                local_15c0._0_4_ = uVar2;
                local_15c0._8_4_ = uVar2;
                local_15c0._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1240 + uVar33);
                local_15b0._4_4_ = uVar2;
                local_15b0._0_4_ = uVar2;
                local_15b0._8_4_ = uVar2;
                local_15b0._12_4_ = uVar2;
                vpcmpeqd_avx2(ZEXT1632(local_1570),ZEXT1632(local_1570));
                uStack_155c = (local_1610.context)->instID[0];
                local_1560 = uStack_155c;
                uStack_1558 = uStack_155c;
                uStack_1554 = uStack_155c;
                uStack_1550 = (local_1610.context)->instPrimID[0];
                uStack_154c = uStack_1550;
                uStack_1548 = uStack_1550;
                uStack_1544 = uStack_1550;
                auVar35 = auVar76._0_16_;
                local_1660 = vmovdqa64_avx512vl(auVar35);
                local_1610.valid = (int *)local_1660;
                local_1610.geometryUserPtr = pGVar9->userPtr;
                local_1610.hit = local_15d0;
                local_1610.N = 4;
                local_15e0 = vmovdqa64_avx512vl(auVar35);
                auVar35 = vmovdqa64_avx512vl(auVar35);
                local_1610.ray = (RTCRayN *)ray;
                if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->occlusionFilterN)(&local_1610);
                  auVar35 = local_1660;
                }
                uVar33 = vptestmd_avx512vl(auVar35,auVar35);
                if ((uVar33 & 0xf) != 0) {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&local_1610);
                    auVar35 = local_1660;
                  }
                  uVar33 = vptestmd_avx512vl(auVar35,auVar35);
                  uVar33 = uVar33 & 0xf;
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar31 = (bool)((byte)uVar33 & 1);
                  auVar36._0_4_ =
                       (uint)bVar31 * auVar35._0_4_ |
                       (uint)!bVar31 * *(int *)(local_1610.ray + 0x80);
                  bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                  auVar36._4_4_ =
                       (uint)bVar31 * auVar35._4_4_ |
                       (uint)!bVar31 * *(int *)(local_1610.ray + 0x84);
                  bVar31 = (bool)((byte)(uVar33 >> 2) & 1);
                  auVar36._8_4_ =
                       (uint)bVar31 * auVar35._8_4_ |
                       (uint)!bVar31 * *(int *)(local_1610.ray + 0x88);
                  bVar31 = SUB81(uVar33 >> 3,0);
                  auVar36._12_4_ =
                       (uint)bVar31 * auVar35._12_4_ |
                       (uint)!bVar31 * *(int *)(local_1610.ray + 0x8c);
                  *(undefined1 (*) [16])(local_1610.ray + 0x80) = auVar36;
                  if ((byte)uVar33 != 0) goto LAB_0079e225;
                }
                auVar60 = ZEXT3264(local_1540);
                *(int *)(ray + k * 4 + 0x80) = local_1540._0_4_;
                local_1648 = local_1648 ^ 1L << (local_1650 & 0x3f);
                auVar67 = ZEXT3264(local_1440);
                auVar68 = ZEXT3264(local_1460);
                auVar69 = ZEXT3264(local_1480);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar70 = ZEXT3264(auVar37);
                auVar71 = ZEXT3264(local_14a0);
                auVar72 = ZEXT3264(local_14c0);
                auVar37 = vmovdqa64_avx512vl(local_14e0);
                auVar73 = ZEXT3264(auVar37);
                auVar37 = vmovdqa64_avx512vl(local_1500);
                auVar74 = ZEXT3264(auVar37);
                auVar75 = ZEXT3264(local_1520);
                auVar35 = vmovdqa64_avx512vl(local_15e0);
                auVar76 = ZEXT1664(auVar35);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar77 = ZEXT3264(auVar37);
                auVar34 = vxorps_avx512vl(auVar34,auVar34);
                auVar78 = ZEXT1664(auVar34);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar79 = ZEXT3264(auVar37);
              }
            } while (local_1648 != 0);
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != local_1628);
    }
LAB_0079e1fb:
    bVar32 = local_1630 != &local_1200;
    if (!bVar32) {
      return bVar32;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }